

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * jsonnet_fmt_snippet(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  bad_alloc *anon_var_0;
  exception *e;
  int *in_stack_000002d0;
  char *in_stack_000002d8;
  char *in_stack_000002e0;
  JsonnetVm *in_stack_000002e8;
  
  pcVar1 = jsonnet_fmt_snippet_aux
                     (in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002d0);
  return pcVar1;
}

Assistant:

char *jsonnet_fmt_snippet(JsonnetVm *vm, const char *filename, const char *snippet, int *error)
{
    TRY
        return jsonnet_fmt_snippet_aux(vm, filename, snippet, error);
    CATCH("jsonnet_fmt_snippet")
    return nullptr;  // Never happens.
}